

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

void __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::BuildRun
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  uint uVar4;
  reference pvVar5;
  long lVar6;
  unsigned_long uVar7;
  reference pvVar8;
  const_reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  uint __tmp;
  ulong uVar12;
  size_type __n;
  unsigned_long uVar13;
  vector<unsigned_int,_true> *this_00;
  idx_t i;
  size_type __n_00;
  pair<unsigned_int,_unsigned_long> *ppVar14;
  long lVar15;
  idx_t i_1;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  RunElement RVar19;
  RunElement SENTINEL;
  array<std::pair<unsigned_int,_unsigned_int>,_32UL> bounds;
  Games games;
  RunElements players;
  RunElement local_568;
  size_type local_558;
  reference local_550;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *local_548;
  ulong local_540;
  reference local_538;
  ulong local_530;
  reference local_528;
  value_type local_520 [64];
  Games local_420;
  RunElements local_230;
  
  pvVar5 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  local_550 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
              ::operator[](&this->tree,level_idx);
  __n_00 = level_idx - 1;
  local_548 = this;
  local_538 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
              ::operator[](&this->tree,__n_00);
  if (level_idx < 2) {
    local_540 = 1;
    uVar16 = 0x20;
  }
  else {
    uVar16 = 0x20;
    do {
      local_540 = uVar16;
      uVar16 = local_540 << 5;
      __n_00 = __n_00 - 1;
    } while (__n_00 != 0);
  }
  this_00 = &local_550->second;
  uVar12 = (long)(pvVar5->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar5->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  local_568.first = 0xffffffff;
  local_568.second = 0xffffffffffffffff;
  local_528 = pvVar5;
  switchD_005700f1::default(local_520,0,0x100);
  lVar6 = 8;
  do {
    *(undefined4 *)((long)local_230._M_elems + lVar6 + -8) = 0;
    *(undefined8 *)((long)&local_230._M_elems[0].first + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x208);
  local_558 = uVar16 * run_idx;
  ppVar14 = local_230._M_elems;
  uVar13 = 0;
  uVar11 = local_540;
  __n = local_558;
  local_530 = uVar16;
  do {
    uVar16 = uVar12;
    if (__n < uVar12) {
      uVar16 = __n;
    }
    uVar1 = uVar11 + __n;
    uVar10 = uVar12;
    if (uVar1 < uVar12) {
      uVar10 = uVar1;
    }
    local_520[uVar13 * 2] = (value_type)uVar16;
    local_520[uVar13 * 2 + 1] = (value_type)uVar10;
    if ((value_type)uVar16 == (value_type)uVar10) {
      ((pair<unsigned_int,_unsigned_long> *)&ppVar14->first)->first = local_568.first;
      uVar7 = local_568.second;
    }
    else {
      pvVar9 = vector<unsigned_int,_true>::operator[](&local_538->first,__n);
      ((pair<unsigned_int,_unsigned_long> *)&ppVar14->first)->first = *pvVar9;
      uVar7 = uVar13;
      uVar11 = local_540;
    }
    ppVar14->second = uVar7;
    uVar13 = uVar13 + 1;
    ppVar14 = ppVar14 + 1;
    __n = uVar1;
  } while (uVar13 != 0x20);
  lVar6 = 8;
  do {
    *(undefined4 *)((long)local_520 + lVar6 + 0xf8) = 0;
    *(undefined8 *)((long)&local_420._M_elems[0].first + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1f8);
  lVar6 = run_idx * ((local_530 >> 5) + 2) * 0x20;
  RVar19 = StartGames(local_548,&local_420,&local_230,&local_568);
  uVar13 = RVar19.second;
  vVar3 = RVar19.first;
  uVar16 = local_558;
  if (vVar3 != local_568.first) goto LAB_00cf409c;
  while (uVar13 != local_568.second) {
LAB_00cf409c:
    do {
      if (((local_550->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (local_550->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish) && ((uVar16 & 0x1f) == 0)) {
        lVar15 = 0;
        local_558 = uVar16;
        do {
          vVar2 = local_520[lVar15 * 2];
          pvVar8 = vector<unsigned_int,_true>::operator[](this_00,lVar6 + lVar15);
          *pvVar8 = vVar2;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        lVar6 = lVar6 + 0x20;
        uVar16 = local_558;
      }
      pvVar8 = vector<unsigned_int,_true>::operator[](&local_528->first,uVar16);
      *pvVar8 = vVar3;
      uVar4 = local_520[uVar13 * 2] + 1;
      local_520[uVar13 * 2] = uVar4;
      if (uVar4 < local_520[uVar13 * 2 + 1]) {
        pvVar9 = vector<unsigned_int,_true>::operator[](&local_538->first,(ulong)uVar4);
        vVar3 = *pvVar9;
        uVar12 = uVar13 + 0x1f;
        do {
          uVar11 = uVar12 - 1;
          uVar12 = uVar11 >> 1;
          uVar4 = local_420._M_elems[uVar12].first;
          if ((uVar4 < vVar3) || ((uVar4 <= vVar3 && (local_420._M_elems[uVar12].second < uVar13))))
          {
            local_420._M_elems[uVar12].first = vVar3;
            uVar7 = local_420._M_elems[uVar12].second;
            local_420._M_elems[uVar12].second = uVar13;
            uVar13 = uVar7;
            vVar3 = uVar4;
          }
        } while (1 < uVar11);
      }
      else {
        uVar12 = uVar13 + 0x1f;
        uVar13 = local_568.second;
        vVar3 = local_568.first;
        do {
          uVar11 = uVar12 - 1;
          uVar12 = uVar11 >> 1;
          uVar4 = local_420._M_elems[uVar12].first;
          if ((uVar4 < vVar3) || ((uVar4 <= vVar3 && (local_420._M_elems[uVar12].second < uVar13))))
          {
            local_420._M_elems[uVar12].first = vVar3;
            uVar7 = local_420._M_elems[uVar12].second;
            local_420._M_elems[uVar12].second = uVar13;
            uVar13 = uVar7;
            vVar3 = uVar4;
          }
        } while (1 < uVar11);
      }
      uVar16 = uVar16 + 1;
    } while (vVar3 != local_568.first);
  }
  if ((local_550->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_550->second).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar15 = 0;
    do {
      lVar17 = 0;
      do {
        vVar3 = local_520[lVar17 * 2];
        pvVar8 = vector<unsigned_int,_true>::operator[](this_00,lVar6 + lVar17);
        *pvVar8 = vVar3;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x20);
      lVar6 = lVar6 + 0x20;
      bVar18 = lVar15 == 0;
      lVar15 = lVar15 + 1;
    } while (bVar18);
  }
  LOCK();
  (local_548->build_complete).super___atomic_base<unsigned_long>._M_i =
       (local_548->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}